

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangle.h
# Opt level: O2

void __thiscall
chrono::geometry::ChTriangle::ChTriangle
          (ChTriangle *this,ChVector<double> *mp1,ChVector<double> *mp2,ChVector<double> *mp3)

{
  (this->super_ChGeometry)._vptr_ChGeometry = (_func_int **)&PTR__ChGeometry_0118a4d0;
  (this->p1).m_data[0] = mp1->m_data[0];
  (this->p1).m_data[1] = mp1->m_data[1];
  (this->p1).m_data[2] = mp1->m_data[2];
  (this->p2).m_data[0] = mp2->m_data[0];
  (this->p2).m_data[1] = mp2->m_data[1];
  (this->p2).m_data[2] = mp2->m_data[2];
  (this->p3).m_data[0] = mp3->m_data[0];
  (this->p3).m_data[1] = mp3->m_data[1];
  (this->p3).m_data[2] = mp3->m_data[2];
  return;
}

Assistant:

ChTriangle(const ChVector<>& mp1, const ChVector<>& mp2, const ChVector<>& mp3) : p1(mp1), p2(mp2), p3(mp3) {}